

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt_endpoint_refiner::refine(dxt_endpoint_refiner *this,params *p,results *r)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  float fVar4;
  double val;
  vec<3U,_float> local_260;
  vec<3U,_float> local_254;
  vec<3U,_float> local_248;
  vec<3U,_float> local_23c;
  undefined1 local_230 [8];
  vec3F h;
  vec3F l;
  vec<3U,_double> local_200;
  vec<3U,_double> local_1e8;
  vec<3U,_double> local_1d0;
  vec<3U,_double> local_1b8;
  vec<3U,_double> local_1a0;
  vec<3U,_double> local_188;
  vec<3U,_double> local_170;
  double local_158;
  double factor;
  vec<3U,_double> local_138;
  undefined1 local_120 [8];
  vec<3U,_double> b;
  vec<3U,_double> a;
  vec<3U,_double> local_d8;
  undefined1 local_c0 [8];
  vec<3U,_double> x;
  double beta;
  double alpha;
  double k;
  undefined1 local_88 [3];
  uint8 c;
  uint i;
  vec<3U,_double> first_color;
  vec<3U,_double> betax_sum;
  vec<3U,_double> alphax_sum;
  double alphabeta_sum;
  double beta2_sum;
  double alpha2_sum;
  results *r_local;
  params *p_local;
  dxt_endpoint_refiner *this_local;
  
  if (p->m_num_pixels == 0) {
    this_local._7_1_ = false;
  }
  else {
    this->m_pParams = p;
    this->m_pResults = r;
    r->m_error = 0xffffffffffffffff;
    r->m_low_color = 0;
    r->m_high_color = 0;
    beta2_sum = 0.0;
    alphabeta_sum = 0.0;
    alphax_sum.m_s[2] = 0.0;
    vec<3U,_double>::vec((vec<3U,_double> *)(betax_sum.m_s + 2),0.0);
    vec<3U,_double>::vec((vec<3U,_double> *)(first_color.m_s + 2),0.0);
    vec<3U,_double>::vec((vec<3U,_double> *)local_88,0.0);
    for (k._4_4_ = 0; k._4_4_ < p->m_num_pixels; k._4_4_ = k._4_4_ + 1) {
      if ((p->m_dxt1_selectors & 1U) == 0) {
        fVar4 = ((float)*(byte *)((long)&g_dxt5_to_linear + (ulong)p->m_pSelectors[k._4_4_]) * 1.0)
                / 7.0;
      }
      else {
        fVar4 = ((float)*(byte *)((long)&g_dxt1_to_linear + (ulong)p->m_pSelectors[k._4_4_]) * 1.0)
                / 3.0;
      }
      alpha = (double)fVar4;
      val = 1.0 - alpha;
      x.m_s[2] = alpha;
      vec<3U,_double>::vec((vec<3U,_double> *)local_c0);
      if ((p->m_dxt1_selectors & 1U) == 0) {
        bVar1 = color_quad<unsigned_char,_int>::operator[]
                          (p->m_pPixels + k._4_4_,p->m_alpha_comp_index);
        vec<3U,_double>::set((vec<3U,_double> *)local_c0,(double)((float)bVar1 / 255.0));
      }
      else {
        bVar1 = color_quad<unsigned_char,_int>::operator[](p->m_pPixels + k._4_4_,0);
        bVar2 = color_quad<unsigned_char,_int>::operator[](p->m_pPixels + k._4_4_,1);
        bVar3 = color_quad<unsigned_char,_int>::operator[](p->m_pPixels + k._4_4_,2);
        vec<3U,_double>::set
                  ((vec<3U,_double> *)local_c0,(double)(((float)bVar1 * 1.0) / 255.0),
                   (double)(((float)bVar2 * 1.0) / 255.0),(double)(((float)bVar3 * 1.0) / 255.0));
      }
      if (k._4_4_ == 0) {
        vec<3U,_double>::operator=((vec<3U,_double> *)local_88,(vec<3U,_double> *)local_c0);
      }
      beta2_sum = val * val + beta2_sum;
      alphabeta_sum = x.m_s[2] * x.m_s[2] + alphabeta_sum;
      alphax_sum.m_s[2] = val * x.m_s[2] + alphax_sum.m_s[2];
      crnlib::operator*(&local_d8,val,(vec<3U,_double> *)local_c0);
      vec<3U,_double>::operator+=((vec<3U,_double> *)(betax_sum.m_s + 2),&local_d8);
      crnlib::operator*((vec<3U,_double> *)(a.m_s + 2),x.m_s[2],(vec<3U,_double> *)local_c0);
      vec<3U,_double>::operator+=
                ((vec<3U,_double> *)(first_color.m_s + 2),(vec<3U,_double> *)(a.m_s + 2));
    }
    vec<3U,_double>::vec((vec<3U,_double> *)(b.m_s + 2));
    vec<3U,_double>::vec((vec<3U,_double> *)local_120);
    if ((alphabeta_sum != 0.0) || (NAN(alphabeta_sum))) {
      if ((beta2_sum != 0.0) || (NAN(beta2_sum))) {
        local_158 = beta2_sum * alphabeta_sum - alphax_sum.m_s[2] * alphax_sum.m_s[2];
        if ((local_158 != 0.0) || (NAN(local_158))) {
          crnlib::operator*(&local_1a0,(vec<3U,_double> *)(betax_sum.m_s + 2),alphabeta_sum);
          crnlib::operator*(&local_1b8,(vec<3U,_double> *)(first_color.m_s + 2),alphax_sum.m_s[2]);
          crnlib::operator-(&local_188,&local_1a0,&local_1b8);
          operator/(&local_170,&local_188,local_158);
          vec<3U,_double>::operator=((vec<3U,_double> *)(b.m_s + 2),&local_170);
          crnlib::operator*(&local_200,(vec<3U,_double> *)(first_color.m_s + 2),beta2_sum);
          crnlib::operator*((vec<3U,_double> *)(l.m_s + 1),(vec<3U,_double> *)(betax_sum.m_s + 2),
                            alphax_sum.m_s[2]);
          crnlib::operator-(&local_1e8,&local_200,(vec<3U,_double> *)(l.m_s + 1));
          operator/(&local_1d0,&local_1e8,local_158);
          vec<3U,_double>::operator=((vec<3U,_double> *)local_120,&local_1d0);
        }
        else {
          vec<3U,_double>::operator=((vec<3U,_double> *)(b.m_s + 2),(vec<3U,_double> *)local_88);
          vec<3U,_double>::operator=((vec<3U,_double> *)local_120,(vec<3U,_double> *)local_88);
        }
      }
      else {
        vec<3U,_double>::clear((vec<3U,_double> *)(b.m_s + 2));
        operator/((vec<3U,_double> *)&factor,(vec<3U,_double> *)(first_color.m_s + 2),alphabeta_sum)
        ;
        vec<3U,_double>::operator=((vec<3U,_double> *)local_120,(vec<3U,_double> *)&factor);
      }
    }
    else {
      operator/(&local_138,(vec<3U,_double> *)(betax_sum.m_s + 2),beta2_sum);
      vec<3U,_double>::operator=((vec<3U,_double> *)(b.m_s + 2),&local_138);
      vec<3U,_double>::clear((vec<3U,_double> *)local_120);
    }
    vec<3U,_float>::vec((vec<3U,_float> *)(h.m_s + 1),0.0);
    vec<3U,_float>::vec((vec<3U,_float> *)local_230,0.0);
    vec<3u,float>::operator=((vec<3u,float> *)(h.m_s + 1),(vec<3U,_double> *)(b.m_s + 2));
    vec<3u,float>::operator=((vec<3u,float> *)local_230,(vec<3U,_double> *)local_120);
    vec<3U,_float>::clamp((vec<3U,_float> *)(h.m_s + 1),0.0,1.0);
    vec<3U,_float>::clamp((vec<3U,_float> *)local_230,0.0,1.0);
    if ((p->m_dxt1_selectors & 1U) == 0) {
      vec<3U,_float>::vec(&local_254,(vec<3U,_float> *)(h.m_s + 1));
      vec<3U,_float>::vec(&local_260,(vec<3U,_float> *)local_230);
      optimize_dxt5(this,&local_254,&local_260);
    }
    else {
      vec<3U,_float>::vec(&local_23c,(vec<3U,_float> *)(h.m_s + 1));
      vec<3U,_float>::vec(&local_248,(vec<3U,_float> *)local_230);
      optimize_dxt1(this,&local_23c,&local_248);
    }
    this_local._7_1_ = r->m_error < p->m_error_to_beat;
  }
  return this_local._7_1_;
}

Assistant:

bool dxt_endpoint_refiner::refine(const params& p, results& r) {
  if (!p.m_num_pixels)
    return false;

  m_pParams = &p;
  m_pResults = &r;

  r.m_error = cUINT64_MAX;
  r.m_low_color = 0;
  r.m_high_color = 0;

  double alpha2_sum = 0.0f;
  double beta2_sum = 0.0f;
  double alphabeta_sum = 0.0f;

  vec<3, double> alphax_sum(0.0f);
  vec<3, double> betax_sum(0.0f);

  vec<3, double> first_color(0.0f);

  // This linear solver is from Squish.
  for (uint i = 0; i < p.m_num_pixels; ++i) {
    uint8 c = p.m_pSelectors[i];

    double k;
    if (p.m_dxt1_selectors)
      k = g_dxt1_to_linear[c] * 1.0f / 3.0f;
    else
      k = g_dxt5_to_linear[c] * 1.0f / 7.0f;

    double alpha = 1.0f - k;
    double beta = k;

    vec<3, double> x;

    if (p.m_dxt1_selectors)
      x.set(p.m_pPixels[i][0] * 1.0f / 255.0f, p.m_pPixels[i][1] * 1.0f / 255.0f, p.m_pPixels[i][2] * 1.0f / 255.0f);
    else
      x.set(p.m_pPixels[i][p.m_alpha_comp_index] / 255.0f);

    if (!i)
      first_color = x;

    alpha2_sum += alpha * alpha;
    beta2_sum += beta * beta;
    alphabeta_sum += alpha * beta;
    alphax_sum += alpha * x;
    betax_sum += beta * x;
  }

  // zero where non-determinate
  vec<3, double> a, b;
  if (beta2_sum == 0.0f) {
    a = alphax_sum / alpha2_sum;
    b.clear();
  } else if (alpha2_sum == 0.0f) {
    a.clear();
    b = betax_sum / beta2_sum;
  } else {
    double factor = alpha2_sum * beta2_sum - alphabeta_sum * alphabeta_sum;
    if (factor != 0.0f) {
      a = (alphax_sum * beta2_sum - betax_sum * alphabeta_sum) / factor;
      b = (betax_sum * alpha2_sum - alphax_sum * alphabeta_sum) / factor;
    } else {
      a = first_color;
      b = first_color;
    }
  }

  vec3F l(0.0f), h(0.0f);
  l = a;
  h = b;

  l.clamp(0.0f, 1.0f);
  h.clamp(0.0f, 1.0f);

  if (p.m_dxt1_selectors)
    optimize_dxt1(l, h);
  else
    optimize_dxt5(l, h);

  return r.m_error < p.m_error_to_beat;
}